

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSAX.c
# Opt level: O3

void unparsedEntityDeclDebug
               (void *ctx,xmlChar *name,xmlChar *publicId,xmlChar *systemId,xmlChar *notationName)

{
  callbacks = callbacks + 1;
  if (quiet != 0) {
    return;
  }
  if (notationName == (xmlChar *)0x0) {
    notationName = (xmlChar *)"(null)";
  }
  if (systemId == (xmlChar *)0x0) {
    systemId = (xmlChar *)"(null)";
  }
  if (publicId == (xmlChar *)0x0) {
    publicId = (xmlChar *)"(null)";
  }
  fprintf(_stdout,"SAX.unparsedEntityDecl(%s, %s, %s, %s)\n",name,publicId,systemId,notationName);
  return;
}

Assistant:

static void
unparsedEntityDeclDebug(void *ctx ATTRIBUTE_UNUSED, const xmlChar *name,
		   const xmlChar *publicId, const xmlChar *systemId,
		   const xmlChar *notationName)
{
const xmlChar *nullstr = BAD_CAST "(null)";

    if (publicId == NULL)
        publicId = nullstr;
    if (systemId == NULL)
        systemId = nullstr;
    if (notationName == NULL)
        notationName = nullstr;
    callbacks++;
    if (quiet)
	return;
    fprintf(stdout, "SAX.unparsedEntityDecl(%s, %s, %s, %s)\n",
            (char *) name, (char *) publicId, (char *) systemId,
	    (char *) notationName);
}